

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  int iVar1;
  code *pcVar2;
  ulong uVar3;
  int overflow;
  secp256k1_ge pt;
  secp256k1_gej res;
  uint local_174;
  void *local_170;
  uchar local_168 [32];
  uchar local_148 [32];
  secp256k1_scalar local_128;
  secp256k1_ge local_108;
  secp256k1_gej local_b0;
  
  local_174 = 0;
  if (output == (uchar *)0x0) {
    secp256k1_ecdh_cold_3();
  }
  else if (point == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdh_cold_2();
  }
  else {
    if (scalar != (uchar *)0x0) {
      pcVar2 = ecdh_hash_function_sha256;
      if (hashfp != (secp256k1_ecdh_hash_function)0x0) {
        pcVar2 = hashfp;
      }
      local_170 = data;
      secp256k1_pubkey_load(ctx,&local_108,point);
      secp256k1_scalar_set_b32(&local_128,scalar,(int *)&local_174);
      uVar3 = (ulong)(((local_128.d[1] == 0 && local_128.d[0] == 0) && local_128.d[2] == 0) &&
                     local_128.d[3] == 0) | (long)(int)local_174;
      local_174 = (uint)uVar3;
      uVar3 = uVar3 - 1;
      local_128.d[0] = (ulong)(local_174 & 1) | local_128.d[0] & uVar3;
      local_128.d[1] = local_128.d[1] & uVar3;
      local_128.d[2] = local_128.d[2] & uVar3;
      local_128.d[3] = uVar3 & local_128.d[3];
      secp256k1_ecmult_const(&local_b0,&local_108,&local_128,0x100);
      secp256k1_ge_set_gej(&local_108,&local_b0);
      secp256k1_fe_normalize(&local_108.x);
      secp256k1_fe_normalize(&local_108.y);
      secp256k1_fe_get_b32(local_148,&local_108.x);
      secp256k1_fe_get_b32(local_168,&local_108.y);
      iVar1 = (*pcVar2)(output,local_148,local_168,local_170);
      return (uint)(local_174 == 0 && iVar1 != 0);
    }
    secp256k1_ecdh_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s, 256);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    memset(x, 0, 32);
    memset(y, 0, 32);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}